

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall
CorUnix::CPalSynchronizationManager::DiscardMonitoredProcesses
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  _MonitoredProcessesListNode *p;
  MonitoredProcessesListNode *pNode;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  while (this->m_pmplnMonitoredProcesses != (MonitoredProcessesListNode *)0x0) {
    p = this->m_pmplnMonitoredProcesses;
    this->m_pmplnMonitoredProcesses = p->pNext;
    CSynchData::Release(p->psdSynchData,pthrCurrent);
    InternalDelete<CorUnix::CPalSynchronizationManager::_MonitoredProcessesListNode>(p);
  }
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  return;
}

Assistant:

void CPalSynchronizationManager::DiscardMonitoredProcesses(
        CPalThread * pthrCurrent)
    {
        MonitoredProcessesListNode * pNode;

        // Grab the monitored processes lock
        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);

        while (m_pmplnMonitoredProcesses)
        {
            pNode = m_pmplnMonitoredProcesses;
            m_pmplnMonitoredProcesses = pNode->pNext;
            pNode->psdSynchData->Release(pthrCurrent);
            InternalDelete(pNode);
        }

        // Release the monitored processes lock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
    }